

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

Text loguru::get_error_context_for(EcEntryBase *ec_head)

{
  char cVar1;
  EcEntryBase *pEVar2;
  char *pcVar3;
  iterator iVar4;
  EcEntryBase **ppEVar5;
  long *plVar6;
  char *pcVar7;
  EcEntryBase **ppEVar8;
  long *plVar9;
  char *pcVar10;
  EcEntryBase *in_RSI;
  char *in_RDI;
  EcEntryBase **ppEVar11;
  vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> stack;
  Text prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  StringStream result;
  allocator<char> local_b9;
  EcEntryBase **local_b8;
  iterator iStack_b0;
  EcEntryBase **local_a8;
  EcEntryBase *local_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  local_b8 = (EcEntryBase **)0x0;
  iStack_b0._M_current = (EcEntryBase **)0x0;
  local_a8 = (EcEntryBase **)0x0;
  local_a0 = in_RSI;
  if (in_RSI != (EcEntryBase *)0x0) {
    do {
      if (iStack_b0._M_current == local_a8) {
        std::vector<loguru::EcEntryBase_const*,std::allocator<loguru::EcEntryBase_const*>>::
        _M_realloc_insert<loguru::EcEntryBase_const*const&>
                  ((vector<loguru::EcEntryBase_const*,std::allocator<loguru::EcEntryBase_const*>> *)
                   &local_b8,iStack_b0,&local_a0);
      }
      else {
        *iStack_b0._M_current = local_a0;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      local_a0 = local_a0->_previous;
    } while (local_a0 != (EcEntryBase *)0x0);
  }
  ppEVar8 = iStack_b0._M_current + -1;
  ppEVar11 = local_b8;
  if (local_b8 < ppEVar8 && local_b8 != iStack_b0._M_current) {
    do {
      ppEVar5 = ppEVar11 + 1;
      pEVar2 = *ppEVar11;
      *ppEVar11 = *ppEVar8;
      *ppEVar8 = pEVar2;
      ppEVar8 = ppEVar8 + -1;
      ppEVar11 = ppEVar5;
    } while (ppEVar5 < ppEVar8);
  }
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  if (local_b8 != iStack_b0._M_current) {
    std::__cxx11::string::append((char *)&local_58);
    iVar4._M_current = iStack_b0._M_current;
    local_38 = in_RDI;
    if (local_b8 != iStack_b0._M_current) {
      ppEVar11 = local_b8;
      do {
        pEVar2 = *ppEVar11;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,pEVar2->_descr,&local_b9);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_98);
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_68 = *plVar9;
          lStack_60 = plVar6[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar9;
          local_78 = (long *)*plVar6;
        }
        local_70 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        pcVar7 = pEVar2->_file;
        pcVar3 = pEVar2->_file;
        do {
          do {
            pcVar10 = pcVar7;
            pcVar7 = pcVar3 + 1;
            cVar1 = *pcVar3;
            pcVar3 = pcVar7;
          } while (cVar1 == '/');
        } while ((cVar1 == '\\') || (pcVar7 = pcVar10, cVar1 != '\0'));
        textprintf((char *)local_98,"[ErrorContext] %*s:%-5u %-20s ",0x17,pcVar10,
                   (ulong)pEVar2->_line,local_78);
        std::__cxx11::string::append((char *)&local_58);
        (**pEVar2->_vptr_EcEntryBase)(pEVar2,&local_58);
        std::__cxx11::string::append((char *)&local_58);
        free(local_98[0]);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 != iVar4._M_current);
    }
    std::__cxx11::string::append((char *)&local_58);
    in_RDI = local_38;
  }
  pcVar3 = local_58;
  pcVar7 = strdup(local_58);
  *(char **)in_RDI = pcVar7;
  if (pcVar3 != &local_48) {
    operator_delete(pcVar3,CONCAT71(uStack_47,local_48) + 1);
  }
  if (local_b8 != (EcEntryBase **)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return (Text)in_RDI;
}

Assistant:

Text get_error_context_for(const EcEntryBase* ec_head)
	{
		std::vector<const EcEntryBase*> stack;
		while (ec_head) {
			stack.push_back(ec_head);
			ec_head = ec_head->_previous;
		}
		std::reverse(stack.begin(), stack.end());

		StringStream result;
		if (!stack.empty()) {
			result.str += "------------------------------------------------\n";
			for (auto entry : stack) {
				const auto description = std::string(entry->_descr) + ":";
				auto prefix = textprintf("[ErrorContext] %*s:%-5u %-20s ",
					LOGURU_FILENAME_WIDTH, filename(entry->_file), entry->_line, description.c_str());
				result.str += prefix.c_str();
				entry->print_value(result);
				result.str += "\n";
			}
			result.str += "------------------------------------------------";
		}
		return Text(STRDUP(result.str.c_str()));
	}